

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::CreateFromEquation(ON_Plane *this,ON_PlaneEquation *eqn)

{
  ON_3dVector local_58;
  ON_3dVector local_40;
  double local_28;
  double d;
  ON_PlaneEquation *pOStack_18;
  bool b;
  ON_PlaneEquation *eqn_local;
  ON_Plane *this_local;
  
  d._7_1_ = 0;
  (this->plane_equation).x = eqn->x;
  (this->plane_equation).y = eqn->y;
  (this->plane_equation).z = eqn->z;
  (this->plane_equation).d = eqn->d;
  (this->zaxis).x = (this->plane_equation).x;
  (this->zaxis).y = (this->plane_equation).y;
  (this->zaxis).z = (this->plane_equation).z;
  pOStack_18 = eqn;
  eqn_local = (ON_PlaneEquation *)this;
  local_28 = ON_3dVector::Length(&this->zaxis);
  if (0.0 < local_28) {
    local_28 = 1.0 / local_28;
    ON_3dVector::operator*=(&this->zaxis,local_28);
    ::operator*(&local_40,-local_28 * (this->plane_equation).d,&this->zaxis);
    ON_3dPoint::operator=(&this->origin,&local_40);
    d._7_1_ = 1;
  }
  ON_3dVector::PerpendicularTo(&this->xaxis,&this->zaxis);
  ON_3dVector::Unitize(&this->xaxis);
  ON_CrossProduct(&local_58,&this->zaxis,&this->xaxis);
  (this->yaxis).x = local_58.x;
  (this->yaxis).y = local_58.y;
  (this->yaxis).z = local_58.z;
  ON_3dVector::Unitize(&this->yaxis);
  return (bool)(d._7_1_ & 1);
}

Assistant:

bool ON_Plane::CreateFromEquation(
  const class ON_PlaneEquation& eqn
  )
{
  bool b = false;
  
  plane_equation = eqn;

  zaxis.x = plane_equation.x;
  zaxis.y = plane_equation.y;
  zaxis.z = plane_equation.z;

  double d = zaxis.Length();
  if (d > 0.0) {
    d = 1.0 / d;
		zaxis *= d;		
    origin = (-d*plane_equation.d)*zaxis;
    b = true;
  }
  xaxis.PerpendicularTo(zaxis);
  xaxis.Unitize();
  yaxis = ON_CrossProduct(zaxis, xaxis);
  yaxis.Unitize();
  return b;
}